

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gost_omac.c
# Opt level: O0

int omac_imit_ctrl(EVP_MD_CTX *ctx,int type,int arg,void *ptr)

{
  int iVar1;
  long lVar2;
  EVP_MD *pEVar3;
  code *pcVar4;
  EVP_CIPHER *key_00;
  undefined8 *in_RCX;
  int in_EDX;
  int in_ESI;
  EVP_MD_CTX *in_RDI;
  EVP_CIPHER *cipher_1;
  int ret_1;
  uchar diversed_key [32];
  OMAC_CTX *c_2;
  OMAC_CTX *c_1;
  gost_mac_key *key;
  int ret;
  EVP_CIPHER *cipher;
  EVP_MD *md;
  OMAC_CTX *c;
  char *in_stack_ffffffffffffff68;
  int in_stack_ffffffffffffff70;
  uchar *in_stack_ffffffffffffff78;
  undefined4 in_stack_ffffffffffffff80;
  undefined4 in_stack_ffffffffffffff84;
  int iVar5;
  OMAC_CTX *in_stack_ffffffffffffff88;
  int local_3c;
  EVP_CIPHER *local_38;
  
  if (in_ESI == 3) {
    lVar2 = EVP_MD_CTX_get0_md_data(in_RDI);
    iVar1 = OBJ_txt2nid(*(char **)(lVar2 + 0x10));
    if (iVar1 == 0x3f7) {
      if ((in_EDX < 1) || (0x10 < in_EDX)) {
        ERR_GOST_error(in_ESI,0x3f7,in_stack_ffffffffffffff68,0);
        return 0;
      }
      *(long *)(lVar2 + 8) = (long)in_EDX;
    }
    else {
      if (iVar1 != 0x4a6) {
        return 0;
      }
      if ((in_EDX < 1) || (8 < in_EDX)) {
        ERR_GOST_error(in_ESI,0x4a6,in_stack_ffffffffffffff68,0);
        return 0;
      }
      *(long *)(lVar2 + 8) = (long)in_EDX;
    }
    return 1;
  }
  if (in_ESI == 4) {
    lVar2 = EVP_MD_CTX_get0_md_data(in_RDI);
    if (*(int *)(lVar2 + 0x18) == 0) {
      ERR_GOST_error(in_ESI,in_stack_ffffffffffffff70,in_stack_ffffffffffffff68,0);
      return 0;
    }
    iVar5 = 0;
    OBJ_txt2nid(*(char **)(lVar2 + 0x10));
    iVar1 = gost_tlstree((int)c_2,(uchar *)diversed_key._24_8_,(uchar *)diversed_key._16_8_,
                         (uchar *)diversed_key._8_8_);
    if (iVar1 == 0) {
      return iVar5;
    }
    key_00 = EVP_get_cipherbyname(*(char **)(lVar2 + 0x10));
    if ((key_00 != (EVP_CIPHER *)0x0) ||
       (key_00 = (EVP_CIPHER *)EVP_CIPHER_fetch(0,*(undefined8 *)(lVar2 + 0x10)),
       key_00 != (EVP_CIPHER *)0x0)) {
      iVar5 = omac_key(in_stack_ffffffffffffff88,
                       (EVP_CIPHER *)CONCAT44(iVar5,in_stack_ffffffffffffff80),(uchar *)key_00,
                       CONCAT44(in_ESI,in_stack_ffffffffffffff70));
    }
    EVP_CIPHER_free(key_00);
    return iVar5;
  }
  if (in_ESI == 0x1003) {
    *(undefined4 *)in_RCX = 0x20;
    return 1;
  }
  if (in_ESI == 0x1004) {
    lVar2 = EVP_MD_CTX_get0_md_data(in_RDI);
    pEVar3 = EVP_MD_CTX_md(in_RDI);
    local_3c = 0;
    if (*(long *)(lVar2 + 0x10) == 0) {
      iVar1 = EVP_MD_is_a(pEVar3,"magma-mac");
      if (iVar1 == 0) {
        iVar1 = EVP_MD_is_a(pEVar3,"kuznyechik-mac");
        if (iVar1 != 0) {
          *(char **)(lVar2 + 0x10) = "kuznyechik-cbc";
        }
      }
      else {
        *(char **)(lVar2 + 0x10) = "magma-cbc";
      }
    }
    local_38 = EVP_get_cipherbyname(*(char **)(lVar2 + 0x10));
    if ((local_38 == (EVP_CIPHER *)0x0) &&
       (local_38 = (EVP_CIPHER *)EVP_CIPHER_fetch(0,*(undefined8 *)(lVar2 + 0x10)),
       local_38 == (EVP_CIPHER *)0x0)) {
      ERR_GOST_error(in_ESI,in_stack_ffffffffffffff70,in_stack_ffffffffffffff68,0);
    }
    else {
      pEVar3 = EVP_MD_CTX_md(in_RDI);
      pcVar4 = (code *)EVP_MD_meth_get_init(pEVar3);
      iVar1 = (*pcVar4)(in_RDI);
      if (iVar1 < 1) {
        ERR_GOST_error(in_ESI,in_stack_ffffffffffffff70,in_stack_ffffffffffffff68,0);
      }
      else {
        EVP_MD_CTX_set_flags(in_RDI,0x100);
        if (*(int *)(lVar2 + 0x18) == 0) {
          if (in_EDX == 0) {
            local_3c = omac_key(in_stack_ffffffffffffff88,
                                (EVP_CIPHER *)
                                CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80),
                                in_stack_ffffffffffffff78,CONCAT44(in_ESI,in_stack_ffffffffffffff70)
                               );
            if (0 < local_3c) {
              *(undefined8 *)(lVar2 + 0x1c) = *(undefined8 *)((long)in_RCX + 4);
              *(undefined8 *)(lVar2 + 0x24) = *(undefined8 *)((long)in_RCX + 0xc);
              *(undefined8 *)(lVar2 + 0x2c) = *(undefined8 *)((long)in_RCX + 0x14);
              *(undefined8 *)(lVar2 + 0x34) = *(undefined8 *)((long)in_RCX + 0x1c);
            }
          }
          else if (in_EDX == 0x20) {
            local_3c = omac_key(in_stack_ffffffffffffff88,
                                (EVP_CIPHER *)
                                CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80),
                                in_stack_ffffffffffffff78,CONCAT44(in_ESI,in_stack_ffffffffffffff70)
                               );
            if (0 < local_3c) {
              *(undefined8 *)(lVar2 + 0x1c) = *in_RCX;
              *(undefined8 *)(lVar2 + 0x24) = in_RCX[1];
              *(undefined8 *)(lVar2 + 0x2c) = in_RCX[2];
              *(undefined8 *)(lVar2 + 0x34) = in_RCX[3];
            }
          }
          else {
            ERR_GOST_error(in_ESI,in_stack_ffffffffffffff70,in_stack_ffffffffffffff68,0);
          }
        }
        else {
          ERR_GOST_error(in_ESI,in_stack_ffffffffffffff70,in_stack_ffffffffffffff68,0);
        }
      }
    }
    EVP_CIPHER_free(local_38);
    if (0 < local_3c) {
      return local_3c;
    }
    return 0;
  }
  return 0;
}

Assistant:

int omac_imit_ctrl(EVP_MD_CTX *ctx, int type, int arg, void *ptr)
{
    switch (type) {
    case EVP_MD_CTRL_KEY_LEN:
        *((unsigned int *)(ptr)) = 32;
        return 1;
    case EVP_MD_CTRL_SET_KEY:
        {
            OMAC_CTX *c = EVP_MD_CTX_md_data(ctx);
            const EVP_MD *md = EVP_MD_CTX_md(ctx);
            EVP_CIPHER *cipher = NULL;
            int ret = 0;

            if (c->cipher_name == NULL) {
                if (EVP_MD_is_a(md, SN_magma_mac))
                    c->cipher_name = SN_magma_cbc;
                else if (EVP_MD_is_a(md, SN_grasshopper_mac))
                    c->cipher_name = SN_grasshopper_cbc;
            }
            if ((cipher =
                 (EVP_CIPHER *)EVP_get_cipherbyname(c->cipher_name)) == NULL
                && (cipher =
                    EVP_CIPHER_fetch(NULL, c->cipher_name, NULL)) == NULL) {
                GOSTerr(GOST_F_OMAC_IMIT_CTRL, GOST_R_CIPHER_NOT_FOUND);
                goto set_key_end;
            }

            if (EVP_MD_meth_get_init(EVP_MD_CTX_md(ctx)) (ctx) <= 0) {
                GOSTerr(GOST_F_OMAC_IMIT_CTRL, GOST_R_MAC_KEY_NOT_SET);
                goto set_key_end;
            }
            EVP_MD_CTX_set_flags(ctx, EVP_MD_CTX_FLAG_NO_INIT);

            if (c->key_set) {
                GOSTerr(GOST_F_OMAC_IMIT_CTRL, GOST_R_BAD_ORDER);
                goto set_key_end;
            }

            if (arg == 0) {
                struct gost_mac_key *key = (struct gost_mac_key *)ptr;
                ret = omac_key(c, cipher, key->key, 32);
                if (ret > 0)
                    memcpy(c->key, key->key, 32);
                goto set_key_end;
            } else if (arg == 32) {
                ret = omac_key(c, cipher, ptr, 32);
                if (ret > 0)
                    memcpy(c->key, ptr, 32);
                goto set_key_end;
            }
            GOSTerr(GOST_F_OMAC_IMIT_CTRL, GOST_R_INVALID_MAC_KEY_SIZE);
          set_key_end:
            EVP_CIPHER_free(cipher);
            if (ret > 0)
                return ret;
            return 0;
        }
    case EVP_MD_CTRL_XOF_LEN:   /* Supported in OpenSSL */
        {
            OMAC_CTX *c = EVP_MD_CTX_md_data(ctx);
            switch (OBJ_txt2nid(c->cipher_name)) {
            case NID_magma_cbc:
                if (arg < 1 || arg > 8) {
                    GOSTerr(GOST_F_OMAC_IMIT_CTRL, GOST_R_INVALID_MAC_SIZE);
                    return 0;
                }
                c->dgst_size = arg;
                break;
            case NID_grasshopper_cbc:
                if (arg < 1 || arg > 16) {
                    GOSTerr(GOST_F_OMAC_IMIT_CTRL, GOST_R_INVALID_MAC_SIZE);
                    return 0;
                }
                c->dgst_size = arg;
                break;
            default:
                return 0;
            }
            return 1;
        }
#ifdef EVP_MD_CTRL_TLSTREE
    case EVP_MD_CTRL_TLSTREE:
        {
            OMAC_CTX *c = EVP_MD_CTX_md_data(ctx);
            if (c->key_set) {
                unsigned char diversed_key[32];
                int ret = 0;
                if (gost_tlstree(OBJ_txt2nid(c->cipher_name),
                                 c->key, diversed_key,
                                 (const unsigned char *)ptr)) {
                    EVP_CIPHER *cipher;
                    if ((cipher = (EVP_CIPHER *)EVP_get_cipherbyname(c->cipher_name))
                        || (cipher = EVP_CIPHER_fetch(NULL, c->cipher_name, NULL)))
                        ret = omac_key(c, cipher, diversed_key, 32);
                    EVP_CIPHER_free(cipher);
                }
                return ret;
            }
            GOSTerr(GOST_F_OMAC_IMIT_CTRL, GOST_R_BAD_ORDER);
            return 0;
        }
#endif
    default:
        return 0;
    }
}